

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Stack * prvTidynewStack(TidyDocImpl *doc,uint capacity)

{
  Stack *pSVar1;
  Node **ppNVar2;
  Stack *stack;
  uint capacity_local;
  TidyDocImpl *doc_local;
  
  pSVar1 = (Stack *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
  pSVar1->top = -1;
  pSVar1->capacity = capacity;
  ppNVar2 = (Node **)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)pSVar1->capacity << 3);
  pSVar1->firstNode = ppNVar2;
  pSVar1->allocator = doc->allocator;
  return pSVar1;
}

Assistant:

Stack* TY_(newStack)(TidyDocImpl *doc, uint capacity)
{
    Stack *stack = (Stack *)TidyAlloc(doc->allocator, sizeof(Stack));
    stack->top = -1;
    stack->capacity = capacity;
    stack->firstNode = (Node **)TidyAlloc(doc->allocator, stack->capacity * sizeof(Node**));
    stack->allocator = doc->allocator;
    return stack;
}